

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Account::account_data_in_tabular_format(Account *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->account_number);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t\t\t\t",5);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->client_id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t\t\t\t",5);
  if (client_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
      (_Base_ptr)0x0) {
    p_Var4 = &client_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    iVar3 = (int)this->client_class;
    p_Var2 = &client_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = client_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (iVar3 <= (int)p_Var4[1]._M_color) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar3];
    } while (p_Var4 != (_Base_ptr)0x0);
    p_Var4 = &client_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    if (((_Rb_tree_header *)p_Var2 != &client_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
       && (p_Var4 = &client_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header,
          (int)p_Var2[1]._M_color <= iVar3)) {
      p_Var4 = p_Var2;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(char *)p_Var4[1]._M_parent,(long)p_Var4[1]._M_left);
  iVar3 = 0xf;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  if (account_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
      (_Base_ptr)0x0) {
    p_Var4 = &account_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    iVar3 = (int)this->account_type;
    p_Var2 = &account_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var4 = account_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (iVar3 <= (int)p_Var4[1]._M_color) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < iVar3];
    } while (p_Var4 != (_Base_ptr)0x0);
    p_Var4 = &account_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    if (((_Rb_tree_header *)p_Var2 != &account_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
       && (p_Var4 = &account_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header,
          (int)p_Var2[1]._M_color <= iVar3)) {
      p_Var4 = p_Var2;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)p_Var4[1]._M_parent,(long)p_Var4[1]._M_left);
  iVar3 = 10;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  poVar1 = std::ostream::_M_insert<double>((double)this->deposit);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Account::account_data_in_tabular_format(){
    /*!
     * It shows accoutn details in a tabular format :
     * account number, client id, account type, deposit amount
     */
    std::cout<<account_number<<"\t\t\t\t\t"<<client_id<<"\t\t\t\t\t"<<client_types.find(client_class)->second;
    int i;
    for(i=0;i<15;i++)
    {
        std::cout<<" ";
    }
    std::cout<<account_types.find(account_type)->second;
    for(i=0;i<10;i++)
    {
        std::cout<<" ";
    }
    std::cout<<deposit<<std::endl;
}